

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_lpf2_get_heap_size(ma_lpf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  uint uVar1;
  ma_result mVar2;
  double __x;
  
  if (pConfig != (ma_lpf2_config *)0x0) {
    __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
    sin(__x);
    sin(1.5707963267948966 - __x);
    mVar2 = MA_INVALID_ARGS;
    if (pHeapSizeInBytes != (size_t *)0x0) {
      uVar1 = pConfig->channels;
      *pHeapSizeInBytes = 0;
      if ((ulong)uVar1 != 0) {
        *pHeapSizeInBytes = (ulong)uVar1 << 3;
        mVar2 = MA_SUCCESS;
      }
    }
    return mVar2;
  }
  __assert_fail("pConfig != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x82f8,"ma_biquad_config ma_lpf2__get_biquad_config(const ma_lpf2_config *)");
}

Assistant:

static MA_INLINE ma_biquad_config ma_lpf2__get_biquad_config(const ma_lpf2_config* pConfig)
{
    ma_biquad_config bqConfig;
    double q;
    double w;
    double s;
    double c;
    double a;

    MA_ASSERT(pConfig != NULL);

    q = pConfig->q;
    w = 2 * MA_PI_D * pConfig->cutoffFrequency / pConfig->sampleRate;
    s = ma_sind(w);
    c = ma_cosd(w);
    a = s / (2*q);

    bqConfig.b0 = (1 - c) / 2;
    bqConfig.b1 =  1 - c;
    bqConfig.b2 = (1 - c) / 2;
    bqConfig.a0 =  1 + a;
    bqConfig.a1 = -2 * c;
    bqConfig.a2 =  1 - a;

    bqConfig.format   = pConfig->format;
    bqConfig.channels = pConfig->channels;

    return bqConfig;
}